

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug-test.c++
# Opt level: O3

void __thiscall
kj::_::anon_unknown_0::MockExceptionCallback::logMessage
          (MockExceptionCallback *this,LogSeverity severity,char *file,int line,int contextDepth,
          String *text)

{
  char *pcVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  String *in_stack_ffffffffffffff98;
  LogSeverity severity_local;
  int contextDepth_local;
  int line_local;
  String local_50;
  char *file_local;
  
  severity_local = severity;
  contextDepth_local = contextDepth;
  line_local = line;
  file_local = file;
  ::std::__cxx11::string::append((char *)&this->text);
  str<char_const*&,char_const(&)[2],int&,char_const(&)[3],int&,char_const(&)[3],kj::LogSeverity&,char_const(&)[3],kj::String>
            (&local_50,(kj *)&file_local,(char **)0x18f05c,(char (*) [2])&line_local,(int *)":+",
             (char (*) [3])&contextDepth_local,(int *)0x191174,(char (*) [3])&severity_local,
             (LogSeverity *)0x191174,(char (*) [3])text,in_stack_ffffffffffffff98);
  pcVar1 = (text->content).ptr;
  if (pcVar1 != (char *)0x0) {
    sVar2 = (text->content).size_;
    pAVar3 = (text->content).disposer;
    (text->content).ptr = (char *)0x0;
    (text->content).size_ = 0;
    (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pcVar1,1,sVar2,sVar2,0);
  }
  (text->content).ptr = local_50.content.ptr;
  (text->content).size_ = local_50.content.size_;
  (text->content).disposer = local_50.content.disposer;
  if (local_50.content.size_ == 0) {
    local_50.content.ptr = (char *)0x0;
  }
  ::std::__cxx11::string::replace
            ((ulong)&this->text,(this->text)._M_string_length,(char *)0x0,
             (ulong)local_50.content.ptr);
  return;
}

Assistant:

void logMessage(LogSeverity severity, const char* file, int line, int contextDepth,
                  String&& text) override {
    this->text += "log message: ";
    text = str(file, ":", line, ":+", contextDepth, ": ", severity, ": ", mv(text));
    this->text.append(text.begin(), text.end());
  }